

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Local * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                  *args_2,AST **args_3)

{
  Local *__x;
  Local *in_RCX;
  LocationRange *in_R8;
  Local *r;
  AST *in_stack_ffffffffffffffc0;
  Binds *in_stack_ffffffffffffffc8;
  Fodder *in_stack_ffffffffffffffd0;
  
  __x = (Local *)operator_new(0xa0);
  Local::Local(in_RCX,in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
             in_stack_ffffffffffffffc0,(value_type *)__x);
  return __x;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }